

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall
pbrt::PaddedSobolSampler::generateSample
          (PaddedSobolSampler *this,span<const_unsigned_int> C,uint32_t a,uint32_t hash)

{
  RandomizeStrategy RVar1;
  size_t sVar2;
  pbrt *this_00;
  Float FVar3;
  span<const_unsigned_int> C_00;
  span<const_unsigned_int> C_01;
  
  sVar2 = C.n;
  this_00 = (pbrt *)C.ptr;
  RVar1 = this->randomizeStrategy;
  if (RVar1 == Owen) {
    C_01.n._0_4_ = a;
    C_01.ptr = (uint *)sVar2;
    C_01.n._4_4_ = 0;
    FVar3 = SampleGeneratorMatrix<pbrt::OwenScrambler>(this_00,C_01,hash,(OwenScrambler)hash);
    return FVar3;
  }
  if (RVar1 != Xor) {
    if (RVar1 == None) {
      FVar3 = SampleGeneratorMatrix<pbrt::NoRandomizer>(this_00,sVar2,a);
      return FVar3;
    }
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/samplers.h"
             ,0xb0,"Unhandled randomization strategy");
  }
  C_00.n._0_4_ = a;
  C_00.ptr = (uint *)sVar2;
  C_00.n._4_4_ = 0;
  FVar3 = SampleGeneratorMatrix<pbrt::XORScrambler>(this_00,C_00,hash,(XORScrambler)hash);
  return FVar3;
}

Assistant:

PBRT_CPU_GPU
    Float generateSample(pstd::span<const uint32_t> C, uint32_t a, uint32_t hash) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return SampleGeneratorMatrix(C, a, NoRandomizer());
        case RandomizeStrategy::Xor:
            return SampleGeneratorMatrix(C, a, XORScrambler(hash));
        case RandomizeStrategy::Owen:
            return SampleGeneratorMatrix(C, a, OwenScrambler(hash));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }